

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O2

int __thiscall DIntermissionScreenCast::Ticker(DIntermissionScreenCast *this)

{
  uint uVar1;
  FState *pFVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  AActor *pAVar6;
  FState *pFVar7;
  
  DIntermissionScreen::Ticker(&this->super_DIntermissionScreen);
  iVar4 = this->casttics;
  this->casttics = iVar4 + -1;
  pFVar7 = this->caststate;
  bVar3 = iVar4 < 2 || pFVar7 == (FState *)0x0;
  if ((bool)(~bVar3 & 1) || pFVar7 == (FState *)0x0) {
    return -(uint)bVar3;
  }
  iVar4 = FState::GetTics(pFVar7);
  if (iVar4 == -1) {
    return -1;
  }
  pFVar7 = this->caststate;
  pFVar2 = pFVar7->NextState;
  if (pFVar2 == (FState *)0x0) {
    return -1;
  }
  if ((pFVar2 == pFVar7) && (this->castdeath != false)) {
    return -1;
  }
  if (pFVar7 != this->advplayerstate) {
    this->caststate = pFVar2;
    PlayAttackSound(this);
    iVar4 = this->castframes + 1;
    this->castframes = iVar4;
    if ((iVar4 == 0xc) && (this->castdeath == false)) {
      this->castattacking = true;
      bVar3 = PClass::IsAncestorOf
                        (APlayerPawn::RegistrationInfo.MyClass,&this->mClass->super_PClass);
      if (bVar3) {
        pAVar6 = this->mDefaults;
LAB_00326ee4:
        pFVar7 = pAVar6->MissileState;
LAB_00326eeb:
        this->caststate = pFVar7;
        this->basestate = pFVar7;
      }
      else {
        uVar1 = this->castonmelee;
        pAVar6 = this->mDefaults;
        pFVar7 = (&pAVar6->MeleeState)[uVar1 == 0];
        this->caststate = pFVar7;
        this->basestate = pFVar7;
        this->castonmelee = uVar1 ^ 1;
        if (pFVar7 == (FState *)0x0) {
          if (uVar1 == 1) goto LAB_00326ee4;
          pFVar7 = pAVar6->MeleeState;
          goto LAB_00326eeb;
        }
      }
      PlayAttackSound(this);
    }
    if (this->castattacking == false) {
      pFVar7 = this->caststate;
      goto LAB_00326f89;
    }
    if ((this->castframes != 0x18) &&
       (pFVar7 = this->caststate, pFVar7 != this->mDefaults->SeeState)) goto LAB_00326f89;
  }
  this->castattacking = false;
  this->castframes = 0;
  pFVar7 = this->mDefaults->SeeState;
  this->caststate = pFVar7;
LAB_00326f89:
  iVar5 = FState::GetTics(pFVar7);
  iVar4 = 0xf;
  if (iVar5 != -1) {
    iVar4 = iVar5;
  }
  this->casttics = iVar4;
  return 0;
}

Assistant:

int DIntermissionScreenCast::Ticker ()
{
	Super::Ticker();

	if (--casttics > 0 && caststate != NULL)
		return 0; 				// not time to change state yet

	if (caststate == NULL || caststate->GetTics() == -1 || caststate->GetNextState() == NULL ||
		(caststate->GetNextState() == caststate && castdeath))
	{
		return -1;
	}
	else
	{
		// just advance to next state in animation
		if (caststate == advplayerstate)
			goto stopattack;	// Oh, gross hack!

		caststate = caststate->GetNextState();

		PlayAttackSound();
		castframes++;
	}

	if (castframes == 12 && !castdeath)
	{
		// go into attack frame
		castattacking = true;
		if (!mClass->IsDescendantOf(RUNTIME_CLASS(APlayerPawn)))
		{
			if (castonmelee)
				basestate = caststate = mDefaults->MeleeState;
			else
				basestate = caststate = mDefaults->MissileState;
			castonmelee ^= 1;
			if (caststate == NULL)
			{
				if (castonmelee)
					basestate = caststate = mDefaults->MeleeState;
				else
					basestate = caststate = mDefaults->MissileState;
			}
		}
		else
		{
			// The players use the melee state differently so it can't be used here
			basestate = caststate = mDefaults->MissileState;
		}
		PlayAttackSound();
	}

	if (castattacking)
	{
		if (castframes == 24 || caststate == mDefaults->SeeState )
		{
		  stopattack:
			castattacking = false;
			castframes = 0;
			caststate = mDefaults->SeeState;
		}
	}

	casttics = caststate->GetTics();
	if (casttics == -1)
		casttics = 15;
	return 0;
}